

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
::Vector_column(Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                *this,Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                      *column,Column_settings *colSettings)

{
  Column_support *this_00;
  ID_index IVar1;
  pointer ppEVar2;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *pEVar3;
  size_t sVar4;
  undefined4 uVar5;
  Entry_constructor *pEVar6;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *pEVar7;
  Field_operators *pFVar8;
  ulong uVar9;
  pointer ppEVar10;
  bool bVar11;
  __alloc_node_gen_t __alloc_node_gen;
  allocator_type local_49;
  Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *local_48;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_40;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_38;
  
  (this->super_Column_dimension_option).dim_ = (column->super_Column_dimension_option).dim_;
  this_00 = &this->column_;
  local_38._M_h = (__hashtable_alloc *)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::vector(this_00,(long)(column->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(column->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_38,
           &local_49);
  local_40 = &this->erasedValues_;
  (this->erasedValues_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->erasedValues_)._M_h._M_bucket_count = (column->erasedValues_)._M_h._M_bucket_count;
  (this->erasedValues_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->erasedValues_)._M_h._M_element_count = (column->erasedValues_)._M_h._M_element_count;
  uVar5 = *(undefined4 *)&(column->erasedValues_)._M_h._M_rehash_policy.field_0x4;
  sVar4 = (column->erasedValues_)._M_h._M_rehash_policy._M_next_resize;
  (this->erasedValues_)._M_h._M_rehash_policy._M_max_load_factor =
       (column->erasedValues_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->erasedValues_)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (this->erasedValues_)._M_h._M_rehash_policy._M_next_resize = sVar4;
  (this->erasedValues_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_48 = this;
  local_38._M_h = (__hashtable_alloc *)local_40;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_40,&(column->erasedValues_)._M_h,&local_38);
  bVar11 = colSettings == (Column_settings *)0x0;
  pFVar8 = (Field_operators *)0x0;
  if (bVar11) {
    pFVar8 = column->operators_;
  }
  this->operators_ = pFVar8;
  pEVar6 = (Entry_constructor *)&colSettings->field_0x20;
  if (bVar11) {
    pEVar6 = column->entryPool_;
  }
  this->entryPool_ = pEVar6;
  if (!bVar11) {
    this->operators_ = &colSettings->operators;
  }
  ppEVar10 = (column->column_).
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (column->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar10 != ppEVar2) {
    uVar9 = 0;
    do {
      pEVar3 = *ppEVar10;
      IVar1 = pEVar3->rowIndex_;
      pEVar7 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                *)operator_new(8);
      (pEVar7->super_Entry_field_element_option).element_ = 0;
      pEVar7->rowIndex_ = IVar1;
      (this_00->
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar9] = pEVar7;
      ((this_00->
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
       )._M_impl.super__Vector_impl_data._M_start[uVar9]->super_Entry_field_element_option).element_
           = (pEVar3->super_Entry_field_element_option).element_;
      uVar9 = (ulong)((int)uVar9 + 1);
      ppEVar10 = ppEVar10 + 1;
    } while (ppEVar10 != ppEVar2);
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(const Vector_column& column, Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      erasedValues_(column.erasedValues_),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");

  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}